

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O3

wchar_t output_byte(archive_write_filter *f,uchar c)

{
  void *pvVar1;
  long lVar2;
  wchar_t wVar3;
  int iVar4;
  
  pvVar1 = f->data;
  lVar2 = *(long *)((long)pvVar1 + 0x65188);
  *(long *)((long)pvVar1 + 0x65188) = lVar2 + 1;
  *(uchar *)(*(long *)((long)pvVar1 + 0x65178) + lVar2) = c;
  *(long *)((long)pvVar1 + 8) = *(long *)((long)pvVar1 + 8) + 1;
  wVar3 = L'\0';
  if (*(size_t *)((long)pvVar1 + 0x65180) == *(size_t *)((long)pvVar1 + 0x65188)) {
    iVar4 = __archive_write_filter
                      (f->next_filter,*(void **)((long)pvVar1 + 0x65178),
                       *(size_t *)((long)pvVar1 + 0x65180));
    wVar3 = L'\xffffffe2';
    if (iVar4 == 0) {
      *(undefined8 *)((long)pvVar1 + 0x65188) = 0;
      wVar3 = L'\0';
    }
  }
  return wVar3;
}

Assistant:

static int
output_byte(struct archive_write_filter *f, unsigned char c)
{
	struct private_data *state = f->data;

	state->compressed[state->compressed_offset++] = c;
	++state->out_count;

	if (state->compressed_buffer_size == state->compressed_offset) {
		int ret = __archive_write_filter(f->next_filter,
		    state->compressed, state->compressed_buffer_size);
		if (ret != ARCHIVE_OK)
			return ARCHIVE_FATAL;
		state->compressed_offset = 0;
	}

	return ARCHIVE_OK;
}